

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  pointer *ppcVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *pvVar2;
  int i_00;
  pointer pcVar3;
  iterator iVar4;
  cmGraphEdge cVar5;
  undefined4 uVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar7;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar8;
  bool bVar9;
  long lVar10;
  pointer pcVar11;
  undefined1 uVar12;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar13;
  int local_54;
  cmGraphEdge local_50;
  cmComputeTargetDepends *local_48;
  int *local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_38;
  
  local_54 = i;
  local_48 = this;
  local_40 = head;
  pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      visited,&local_54);
  if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00434473:
    bVar9 = false;
  }
  else {
    pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
             _M_insert_unique<int_const&>
                       ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        emitted,&local_54);
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      lVar10 = (long)local_54;
      pcVar3 = (local_48->InitialGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar11 = *(pointer *)
                 &pcVar3[lVar10].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      uVar12 = pcVar11 ==
               *(pointer *)
                ((long)&pcVar3[lVar10].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      psVar8 = emitted;
      uVar6 = local_50._4_4_;
      psVar7 = local_38;
      while (local_38 = psVar8, !(bool)uVar12) {
        i_00 = pcVar11->Dest;
        local_50._4_4_ = uVar6;
        if (((cmap->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[i_00] == c) && (*(bool *)((long)pcVar11 + 4) == true)) {
          pvVar2 = &(*(pointer *)
                      &((Graph *)((long)local_48 + 0x70))->
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>)[local_54].
                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          local_50._5_3_ = SUB43((uint)uVar6 >> 8,0);
          local_50.Strong = true;
          iVar4._M_current =
               (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_50.Dest = i_00;
          if (iVar4._M_current ==
              (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                      (pvVar2,iVar4,&local_50);
          }
          else {
            cVar5.Strong = true;
            cVar5._5_3_ = local_50._5_3_;
            cVar5.Dest = i_00;
            *iVar4._M_current = cVar5;
            ppcVar1 = &(pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          bVar9 = IntraComponent(local_48,cmap,c,i_00,local_40,local_38,visited);
          if (!bVar9) goto LAB_0043446a;
        }
        pcVar11 = (pointer)((long)pcVar11 + 8);
        psVar8 = local_38;
        uVar6 = local_50._4_4_;
        psVar7 = local_38;
        uVar12 = pcVar11 ==
                 *(pointer *)
                  ((long)&pcVar3[lVar10].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                          super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      }
      local_50.Dest = *local_40;
      if (local_50.Dest < 0) {
        (*(pointer *)
          &((vector<int,_std::allocator<int>_> *)((long)local_48 + 0xa0))->
           super__Vector_base<int,_std::allocator<int>_>)[c] = local_54;
      }
      else {
        pvVar2 = &(*(pointer *)
                    &((Graph *)((long)local_48 + 0x70))->
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>)[local_54].
                  super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        local_50._4_4_ = uVar6 & 0xffffff00;
        iVar4._M_current =
             (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_38 = psVar7;
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                    (pvVar2,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = (cmGraphEdge)(CONCAT44(uVar6,local_50.Dest) & 0xffffff00ffffffff);
          ppcVar1 = &(pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      *local_40 = local_54;
LAB_0043446a:
      if (!(bool)uVar12) goto LAB_00434473;
    }
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (EdgeList::const_iterator ei = el.begin(); ei != el.end(); ++ei) {
      int j = *ei;
      if (cmap[j] == c && ei->IsStrong()) {
        this->FinalGraph[i].push_back(cmGraphEdge(j, true));
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].push_back(cmGraphEdge(*head, false));
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}